

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes1.cc
# Opt level: O2

void __thiscall Node::PrintTree(Node *this,string *Level,int Flag,char Node)

{
  long lVar1;
  VARTYPE VarType;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  int Flag_00;
  int loop;
  long lVar5;
  string NextLevel;
  string DownLevel;
  
  DownLevel._M_dataplus._M_p = (pointer)&DownLevel.field_2;
  DownLevel._M_string_length = 0;
  DownLevel.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&DownLevel);
  std::operator+(&NextLevel,Level,&DownLevel);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)Level);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,Node);
  poVar2 = std::operator<<(poVar2,"-");
  std::ostream::operator<<((ostream *)poVar2,this->Type);
  if ((this->TextValue)._M_string_length != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout," Text: ");
    std::operator<<(poVar2,(string *)&this->TextValue);
  }
  poVar2 = std::operator<<((ostream *)&std::cout," <");
  VarType = GetNodeVarType(this);
  pcVar3 = DumpVarType(VarType);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,">");
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  for (lVar5 = 0; lVar5 != 5; lVar5 = lVar5 + 1) {
    if (this->Tree[lVar5] != (Node *)0x0) {
      Flag_00 = 0;
      lVar4 = lVar5;
      while (lVar4 != 4) {
        lVar1 = lVar4 + 1;
        lVar4 = lVar4 + 1;
        if (this->Tree[lVar1] != (Node *)0x0) {
          Flag_00 = 1;
        }
      }
      PrintTree(this->Tree[lVar5],&NextLevel,Flag_00,(byte)lVar5 | 0x30);
    }
  }
  if (this->Block[1] != (Node *)0x0) {
    PrintTree(this->Block[1],&NextLevel,0,'T');
  }
  if (this->Block[2] != (Node *)0x0) {
    PrintTree(this->Block[2],&NextLevel,0,'E');
  }
  if (this->Block[0] != (Node *)0x0) {
    PrintTree(this->Block[0],Level,0,'D');
  }
  std::__cxx11::string::~string((string *)&NextLevel);
  std::__cxx11::string::~string((string *)&DownLevel);
  return;
}

Assistant:

void Node::PrintTree(
	const std::string &Level,	/**< Current indent level */
	int Flag,			/**< Output Flags */
	char Node			/**< Character to link to indent level */
)
{
	//
	// Local variables
	//
	std::string DownLevel;

	//
	// Make sure we have an active node
	//
	if ((Block[0] != 0) || (Block[1] != 0) ||
		(Block[2] != 0) || Flag)
	{
		DownLevel = " | ";
	}
	else
	{
		DownLevel = "   ";
	}

	std::string NextLevel = Level + DownLevel;

	//
	// Print bars for this level
	//
	std::cout << Level << " " << Node << "-" << Type;

	if (TextValue.length() != 0)
	{
		std::cout << " Text: " << TextValue;
	}

	//
	// Output variable type
	//
	std::cout << " <" << DumpVarType(GetNodeVarType()) << ">";

	std::cout << std::endl;

	//
	// Print Parameter Levels
	//
	for (int loop = 0; loop < 5; loop++)
	{
		if (Tree[loop] != 0)
		{
			int fflag = 0;
			for (int inloop = loop + 1; inloop < 5; inloop++)
			{
				if (Tree[inloop] != 0)
				{
					fflag = 1;
				}
			}
			Tree[loop]->PrintTree(NextLevel, fflag, loop + '0');
		}
	}

	//
	// Link down to next parent if possible
	//
	if (Block[1] != 0)
	{
		Block[1]->PrintTree(NextLevel, 0, 'T');
	}
	if (Block[2] != 0)
	{
		Block[2]->PrintTree(NextLevel, 0, 'E');
	}
	if (Block[0] != 0)
	{
		Block[0]->PrintTree(Level, 0, 'D');
	}
}